

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestraintStamp.cpp
# Opt level: O0

void __thiscall OpenMD::RestraintStamp::~RestraintStamp(RestraintStamp *this)

{
  DataHolder *in_RDI;
  
  ((ParameterBase *)&in_RDI->_vptr_DataHolder)->_vptr_ParameterBase =
       (_func_int **)&PTR__RestraintStamp_004ea248;
  Parameter<bool>::~Parameter((Parameter<bool> *)0x392ced);
  Parameter<double>::~Parameter((Parameter<double> *)0x392cfe);
  Parameter<double>::~Parameter((Parameter<double> *)0x392d0f);
  Parameter<double>::~Parameter((Parameter<double> *)0x392d20);
  Parameter<double>::~Parameter((Parameter<double> *)0x392d31);
  Parameter<double>::~Parameter((Parameter<double> *)0x392d42);
  Parameter<double>::~Parameter((Parameter<double> *)0x392d53);
  Parameter<double>::~Parameter((Parameter<double> *)0x392d64);
  Parameter<double>::~Parameter((Parameter<double> *)0x392d75);
  Parameter<double>::~Parameter((Parameter<double> *)0x392d86);
  Parameter<int>::~Parameter((Parameter<int> *)0x392d97);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI);
  DataHolder::~DataHolder(in_RDI);
  return;
}

Assistant:

RestraintStamp::~RestraintStamp() {}